

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stats.c
# Opt level: O1

void mi_stat_update(mi_stat_count_t *stat,int64_t amount)

{
  int64_t *piVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  bool bVar5;
  
  if (amount != 0) {
    if (stat < &thread_count && (mi_stat_count_t *)0x30957f < stat) {
      LOCK();
      piVar1 = &stat->current;
      lVar2 = *piVar1;
      *piVar1 = *piVar1 + amount;
      UNLOCK();
      lVar3 = stat->peak;
      do {
        if (lVar2 + amount <= lVar3) break;
        LOCK();
        lVar4 = stat->peak;
        bVar5 = lVar3 == lVar4;
        if (bVar5) {
          stat->peak = lVar2 + amount;
          lVar4 = lVar3;
        }
        UNLOCK();
        lVar3 = lVar4;
      } while (!bVar5);
      if (0 < amount) {
        LOCK();
        stat->total = stat->total + amount;
        UNLOCK();
        return;
      }
    }
    else {
      lVar2 = stat->current + amount;
      stat->current = lVar2;
      if (stat->peak < lVar2) {
        stat->peak = lVar2;
      }
      if (0 < amount) {
        stat->total = stat->total + amount;
      }
    }
  }
  return;
}

Assistant:

static void mi_stat_update(mi_stat_count_t* stat, int64_t amount) {
  if (amount == 0) return;
  if mi_unlikely(mi_is_in_main(stat))
  {
    // add atomically (for abandoned pages)
    int64_t current = mi_atomic_addi64_relaxed(&stat->current, amount);
    // if (stat == &_mi_stats_main.committed) { mi_assert_internal(current + amount >= 0); };
    mi_atomic_maxi64_relaxed(&stat->peak, current + amount);
    if (amount > 0) {
      mi_atomic_addi64_relaxed(&stat->total,amount);
    }
  }
  else {
    // add thread local
    stat->current += amount;
    if (stat->current > stat->peak) { stat->peak = stat->current; }
    if (amount > 0) { stat->total += amount; }
  }
}